

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codec.h
# Opt level: O0

string * rest_rpc::rpc_service::msgpack_codec::
         pack_args_str<rest_rpc::result_code,std::__cxx11::string,void>
                   (result_code arg,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  char *pcVar1;
  size_t sVar2;
  short in_SI;
  string *in_RDI;
  buffer_type buffer;
  tuple<int_&&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&&>
  *in_stack_ffffffffffffff68;
  sbuffer *in_stack_ffffffffffffff70;
  int *in_stack_ffffffffffffff78;
  allocator *paVar3;
  sbuffer *in_stack_ffffffffffffff80;
  allocator local_55 [17];
  int local_44;
  sbuffer local_30;
  short local_a;
  
  local_a = in_SI;
  msgpack::v1::sbuffer::sbuffer(in_stack_ffffffffffffff80,(size_t)in_stack_ffffffffffffff78);
  local_44 = (int)local_a;
  std::forward_as_tuple<int,std::__cxx11::string>
            (in_stack_ffffffffffffff78,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffff70);
  msgpack::v1::pack<msgpack::v1::sbuffer,std::tuple<int&&,std::__cxx11::string&&>>
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  pcVar1 = msgpack::v1::sbuffer::data(&local_30);
  sVar2 = msgpack::v1::sbuffer::size(&local_30);
  paVar3 = local_55;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(in_RDI,pcVar1,sVar2,paVar3);
  std::allocator<char>::~allocator((allocator<char> *)local_55);
  msgpack::v1::sbuffer::~sbuffer((sbuffer *)0x28814a);
  return in_RDI;
}

Assistant:

static std::string pack_args_str(Arg arg, Args &&...args) {
    buffer_type buffer(init_size);
    msgpack::pack(buffer,
                  std::forward_as_tuple((int)arg, std::forward<Args>(args)...));
    return std::string(buffer.data(), buffer.size());
  }